

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall ncnn::Net::load_model(Net *this,char *modelpath)

{
  int iVar1;
  FILE *__stream;
  
  __stream = fopen(modelpath,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"fopen %s failed\n",modelpath);
    iVar1 = -1;
  }
  else {
    iVar1 = load_model(this,(FILE *)__stream);
    fclose(__stream);
  }
  return iVar1;
}

Assistant:

int Net::load_model(const char* modelpath)
{
    FILE* fp = fopen(modelpath, "rb");
    if (!fp)
    {
        fprintf(stderr, "fopen %s failed\n", modelpath);
        return -1;
    }

    int ret = load_model(fp);

    fclose(fp);

    return ret;
}